

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrRect3DfFB *value,string *prefix,
               string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  bool bVar1;
  invalid_argument *piVar2;
  XrGeneratedDispatchTable *pXVar3;
  XrRect3DfFB *in_stack_ffffffffffffff08;
  allocator local_e9;
  string offset_prefix;
  string extent_prefix;
  undefined1 local_a8 [32];
  string local_88;
  undefined1 local_68 [32];
  string local_48;
  
  PointerToHexString<XrRect3DfFB>(in_stack_ffffffffffffff08);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&offset_prefix);
  std::__cxx11::string::~string((string *)&offset_prefix);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&offset_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&offset_prefix);
  std::__cxx11::string::string((string *)(local_68 + 0x20),(string *)&offset_prefix);
  pXVar3 = (XrGeneratedDispatchTable *)local_68;
  std::__cxx11::string::string((string *)pXVar3,"XrOffset3DfFB",(allocator *)&extent_prefix);
  bVar1 = ApiDumpOutputXrStruct
                    (pXVar3,&value->offset,(string *)(local_68 + 0x20),(string *)local_68,false,
                     contents);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(local_68 + 0x20));
  if (!bVar1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Invalid Operation");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&extent_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&extent_prefix);
  std::__cxx11::string::string((string *)(local_a8 + 0x20),(string *)&extent_prefix);
  pXVar3 = (XrGeneratedDispatchTable *)local_a8;
  std::__cxx11::string::string((string *)pXVar3,"XrExtent3DfFB",&local_e9);
  bVar1 = ApiDumpOutputXrStruct
                    (pXVar3,&value->extent,(string *)(local_a8 + 0x20),(string *)local_a8,false,
                     contents);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)(local_a8 + 0x20));
  if (bVar1) {
    std::__cxx11::string::~string((string *)&extent_prefix);
    std::__cxx11::string::~string((string *)&offset_prefix);
    return true;
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar2,"Invalid Operation");
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrRect3DfFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string offset_prefix = prefix;
        offset_prefix += "offset";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->offset, offset_prefix, "XrOffset3DfFB", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string extent_prefix = prefix;
        extent_prefix += "extent";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->extent, extent_prefix, "XrExtent3DfFB", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}